

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

Integer pnga_sprs_array_create(Integer idim,Integer jdim,Integer type,Integer size)

{
  Integer IVar1;
  Integer *pIVar2;
  void *pvVar3;
  Integer in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int local_sync_end;
  int local_sync_begin;
  Integer s_a;
  Integer hdl;
  Integer i;
  Integer in_stack_00000158;
  char *in_stack_00000160;
  int iVar4;
  int iVar5;
  long local_38;
  long local_28;
  
  iVar4 = _ga_sync_end;
  iVar5 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar5 != 0) {
    pnga_pgroup_get_default();
    pnga_pgroup_sync(CONCAT44(iVar5,iVar4));
  }
  IVar1 = pnga_type_f2c((long)in_EDX);
  if (999 < IVar1) {
    IVar1 = pnga_type_f2c((long)in_EDX);
    if (IVar1 < 0x4e8) {
      pnga_type_f2c((long)in_EDX);
    }
  }
  if ((in_RDI < 1) || (in_RSI < 1)) {
    pnga_error(in_stack_00000160,in_stack_00000158);
  }
  local_28 = 0;
  do {
    if (0x7fff < local_28) {
LAB_00190ec9:
      if (iVar4 != 0) {
        pnga_pgroup_get_default();
        pnga_pgroup_sync(CONCAT44(iVar5,iVar4));
      }
      return local_38;
    }
    if (SPA[local_28].active == 0) {
      SPA[local_28].active = 1;
      pIVar2 = (Integer *)malloc(0x2000);
      SPA[local_28].idx = pIVar2;
      pIVar2 = (Integer *)malloc(0x2000);
      SPA[local_28].jdx = pIVar2;
      IVar1 = pnga_type_f2c((long)in_EDX);
      SPA[local_28].type = IVar1;
      SPA[local_28].idx_size = in_RCX;
      SPA[local_28].size = ga_types[SPA[local_28].type + -1000].size;
      pvVar3 = malloc(SPA[local_28].size << 10);
      SPA[local_28].val = pvVar3;
      SPA[local_28].nval = 0;
      SPA[local_28].maxval = 0x400;
      SPA[local_28].idim = in_RDI;
      SPA[local_28].jdim = in_RSI;
      IVar1 = pnga_pgroup_get_default();
      SPA[local_28].grp = IVar1;
      IVar1 = pnga_pgroup_nnodes(SPA[local_28].grp);
      SPA[local_28].nprocs = IVar1;
      local_38 = local_28 + -1000;
      goto LAB_00190ec9;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

Integer pnga_sprs_array_create(Integer idim, Integer jdim, Integer type, Integer size)
{
  Integer i, hdl, s_a;
  int local_sync_begin,local_sync_end;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(pnga_pgroup_get_default());
  GAvalidtypeM(pnga_type_f2c((int)type));
  if (idim <= 0 || jdim <= 0)
    pnga_error("(ga_sprs_array_create) Invalid array dimenensions",0);
  for (i=0; i<MAX_ARRAYS; i++) {
    if (!SPA[i].active) {
      SPA[i].active = 1;
      SPA[i].idx = (Integer*)malloc(INIT_BUF_SIZE*sizeof(Integer));
      SPA[i].jdx = (Integer*)malloc(INIT_BUF_SIZE*sizeof(Integer));
      SPA[i].type = pnga_type_f2c((int)(type));
      SPA[i].idx_size = size;
      SPA[i].size = GAsizeofM(SPA[i].type);
      SPA[i].val = malloc(INIT_BUF_SIZE*SPA[i].size);
      SPA[i].nval = 0;
      SPA[i].maxval = INIT_BUF_SIZE;
      SPA[i].idim = idim;
      SPA[i].jdim = jdim;
      SPA[i].grp = pnga_pgroup_get_default();
      SPA[i].nprocs = pnga_pgroup_nnodes(SPA[i].grp);
      hdl = i;
      s_a = hdl - GA_OFFSET;
      break;
    }
  }
  if (local_sync_end) pnga_pgroup_sync(pnga_pgroup_get_default());
  return s_a;
}